

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O2

UniformBufferInfo * __thiscall
Diligent::ShaderResourcesGL::GetUniformBuffer(ShaderResourcesGL *this,Uint32 Index)

{
  char (*in_R8) [18];
  string msg;
  Uint32 local_34;
  string local_30;
  
  if (this->m_NumUniformBuffers <= Index) {
    local_34 = Index;
    FormatString<char[23],unsigned_int,char[18]>
              (&local_30,(Diligent *)"Uniform buffer index (",(char (*) [23])&local_34,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x132);
    std::__cxx11::string::~string((string *)&local_30);
    Index = local_34;
  }
  return this->m_UniformBuffers + Index;
}

Assistant:

const UniformBufferInfo& GetUniformBuffer(Uint32 Index) const
    {
        VERIFY(Index < m_NumUniformBuffers, "Uniform buffer index (", Index, ") is out of range");
        return m_UniformBuffers[Index];
    }